

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  char *__s;
  long lVar3;
  int i;
  long lVar4;
  MessageGenerator messageGenerator;
  allocator<char> local_61;
  EnumGenerator local_60;
  
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",*(string **)this->file_);
  if ((this->java_package_)._M_string_length != 0) {
    io::Printer::Print(printer,"package $package$;\n\n","package",&this->java_package_);
  }
  io::Printer::Print(printer,"public final class $classname$ {\n  private $classname$() {}\n",
                     "classname",&this->classname_);
  io::Printer::Indent(printer);
  __s = "";
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) == 3) {
    __s = "Lite";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  io::Printer::Print(printer,
                     "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry$lite$ registry) {\n"
                     ,"lite",(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; pFVar2 = this->file_, lVar4 < *(int *)(pFVar2 + 0x78); lVar4 = lVar4 + 1) {
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)&local_60,(FieldDescriptor *)(*(long *)(pFVar2 + 0x80) + lVar3)
              );
    ExtensionGenerator::GenerateRegistrationCode((ExtensionGenerator *)&local_60,printer);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&local_60);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x48); lVar4 = lVar4 + 1) {
    MessageGenerator::MessageGenerator
              ((MessageGenerator *)&local_60,(Descriptor *)(*(long *)(pFVar2 + 0x50) + lVar3));
    MessageGenerator::GenerateExtensionRegistrationCode((MessageGenerator *)&local_60,printer);
    MessageGenerator::~MessageGenerator((MessageGenerator *)&local_60);
    pFVar2 = this->file_;
    lVar3 = lVar3 + 0x78;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  pFVar2 = this->file_;
  if (*(char *)(*(long *)(pFVar2 + 0x88) + 0x54) == '\0') {
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x58); lVar4 = lVar4 + 1) {
      EnumGenerator::EnumGenerator(&local_60,(EnumDescriptor *)(*(long *)(pFVar2 + 0x60) + lVar3));
      EnumGenerator::Generate(&local_60,printer);
      EnumGenerator::~EnumGenerator(&local_60);
      pFVar2 = this->file_;
      lVar3 = lVar3 + 0x38;
    }
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x48); lVar4 = lVar4 + 1) {
      MessageGenerator::MessageGenerator
                ((MessageGenerator *)&local_60,(Descriptor *)(*(long *)(pFVar2 + 0x50) + lVar3));
      MessageGenerator::GenerateInterface((MessageGenerator *)&local_60,printer);
      MessageGenerator::Generate((MessageGenerator *)&local_60,printer);
      MessageGenerator::~MessageGenerator((MessageGenerator *)&local_60);
      pFVar2 = this->file_;
      lVar3 = lVar3 + 0x78;
    }
    bVar1 = HasGenericServices(pFVar2);
    if (bVar1) {
      lVar3 = 0;
      for (lVar4 = 0; lVar4 < *(int *)(this->file_ + 0x68); lVar4 = lVar4 + 1) {
        ServiceGenerator::ServiceGenerator
                  ((ServiceGenerator *)&local_60,
                   (ServiceDescriptor *)(*(long *)(this->file_ + 0x70) + lVar3));
        ServiceGenerator::Generate((ServiceGenerator *)&local_60,printer);
        ServiceGenerator::~ServiceGenerator((ServiceGenerator *)&local_60);
        lVar3 = lVar3 + 0x30;
      }
    }
  }
  lVar3 = 0;
  for (lVar4 = 0; pFVar2 = this->file_, lVar4 < *(int *)(pFVar2 + 0x78); lVar4 = lVar4 + 1) {
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)&local_60,(FieldDescriptor *)(*(long *)(pFVar2 + 0x80) + lVar3)
              );
    ExtensionGenerator::Generate((ExtensionGenerator *)&local_60,printer);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&local_60);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x48); lVar4 = lVar4 + 1) {
    MessageGenerator::MessageGenerator
              ((MessageGenerator *)&local_60,(Descriptor *)(*(long *)(pFVar2 + 0x50) + lVar3));
    MessageGenerator::GenerateStaticVariables((MessageGenerator *)&local_60,printer);
    MessageGenerator::~MessageGenerator((MessageGenerator *)&local_60);
    pFVar2 = this->file_;
    lVar3 = lVar3 + 0x78;
  }
  io::Printer::Print(printer,"\n");
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) == 3) {
    io::Printer::Print(printer,"static {\n");
    io::Printer::Indent(printer);
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(this->file_ + 0x48); lVar4 = lVar4 + 1) {
      MessageGenerator::MessageGenerator
                ((MessageGenerator *)&local_60,(Descriptor *)(*(long *)(this->file_ + 0x50) + lVar3)
                );
      MessageGenerator::GenerateStaticVariableInitializers((MessageGenerator *)&local_60,printer);
      MessageGenerator::~MessageGenerator((MessageGenerator *)&local_60);
      lVar3 = lVar3 + 0x78;
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  else {
    GenerateEmbeddedDescriptor(this,printer);
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(outer_class_scope)\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
      "package $package$;\n"
      "\n",
      "package", java_package_);
  }
  printer->Print(
    "public final class $classname$ {\n"
    "  private $classname$() {}\n",
    "classname", classname_);
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
    "public static void registerAllExtensions(\n"
    "    com.google.protobuf.ExtensionRegistry$lite$ registry) {\n",
    "lite", HasDescriptorMethods(file_) ? "" : "Lite");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i)).GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    MessageGenerator(file_->message_type(i))
      .GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");

  // -----------------------------------------------------------------

  if (!file_->options().java_multiple_files()) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      EnumGenerator(file_->enum_type(i)).Generate(printer);
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator messageGenerator(file_->message_type(i));
      messageGenerator.GenerateInterface(printer);
      messageGenerator.Generate(printer);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        ServiceGenerator(file_->service(i)).Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i)).Generate(printer);
  }

  // Static variables.
  for (int i = 0; i < file_->message_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(file_->message_type(i)).GenerateStaticVariables(printer);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_)) {
    GenerateEmbeddedDescriptor(printer);
  } else {
    printer->Print(
      "static {\n");
    printer->Indent();

    for (int i = 0; i < file_->message_type_count(); i++) {
      // TODO(kenton):  Reuse MessageGenerator objects?
      MessageGenerator(file_->message_type(i))
        .GenerateStaticVariableInitializers(printer);
    }

    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}